

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_deviate_delete_unique
              (lys_module *module,lys_deviate *deviate,lys_node_list *list,int index,char *value)

{
  lys_ext_instance ***ext;
  int iVar1;
  lys_unique *plVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  lys_unique *plVar6;
  
  plVar6 = (lys_unique *)&list->unique;
  uVar4 = 0;
  do {
    if (uVar4 == list->unique_size) {
      ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"unique");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value differs from the target being deleted.");
      return 1;
    }
    plVar2 = *(lys_unique **)plVar6;
    bVar3 = plVar2[uVar4].expr_size;
    if (bVar3 == deviate->unique[index].expr_size) {
      uVar5 = 0;
      while( true ) {
        if (bVar3 == uVar5) goto LAB_00149e8d;
        if (plVar2[uVar4].expr[uVar5] != deviate->unique[index].expr[uVar5]) break;
        uVar5 = uVar5 + 1;
      }
      if (bVar3 == uVar5) {
LAB_00149e8d:
        for (uVar5 = 0; uVar5 < plVar2[uVar4].expr_size; uVar5 = uVar5 + 1) {
          lydict_remove(module->ctx,plVar2[uVar4].expr[uVar5]);
          plVar2 = *(lys_unique **)plVar6;
        }
        free(plVar2[uVar4].expr);
        bVar3 = list->unique_size - 1;
        list->unique_size = bVar3;
        if (uVar4 != bVar3) {
          plVar2 = *(lys_unique **)plVar6;
          plVar2[uVar4].expr_size = plVar2[bVar3].expr_size;
          plVar2[uVar4].expr = plVar2[bVar3].expr;
        }
        plVar2 = *(lys_unique **)plVar6;
        if (bVar3 == 0) {
          free(plVar2);
        }
        else {
          plVar6 = plVar2 + bVar3;
          plVar2[bVar3].expr_size = '\0';
        }
        plVar6->expr = (char **)0x0;
        ext = &list->ext;
        iVar1 = -1;
        while (iVar1 = lys_ext_iter(*ext,list->ext_size,(char)iVar1 + '\x01',LYEXT_SUBSTMT_UNIQUE),
              iVar1 != -1) {
          bVar3 = (*ext)[iVar1]->insubstmt_index;
          if ((uint)uVar4 == (uint)bVar3) {
            lyp_ext_instance_rm(module->ctx,ext,&list->ext_size,(uint8_t)iVar1);
            iVar1 = iVar1 + -1;
          }
          else if ((uint)uVar4 < (uint)bVar3) {
            (*ext)[iVar1]->insubstmt_index = bVar3 - 1;
          }
        }
        return 0;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int
yang_deviate_delete_unique(struct lys_module *module, struct lys_deviate *deviate,
                           struct lys_node_list *list, int index, char * value)
{
    int i, j, k;

    /* find unique structures to delete */
    for (i = 0; i < list->unique_size; i++) {
        if (list->unique[i].expr_size != deviate->unique[index].expr_size) {
            continue;
        }

        for (j = 0; j < deviate->unique[index].expr_size; j++) {
            if (!ly_strequal(list->unique[i].expr[j], deviate->unique[index].expr[j], 1)) {
                break;
            }
        }

        if (j == deviate->unique[index].expr_size) {
            /* we have a match, free the unique structure ... */
            for (j = 0; j < list->unique[i].expr_size; j++) {
                lydict_remove(module->ctx, list->unique[i].expr[j]);
            }
            free(list->unique[i].expr);
            /* ... and maintain the array */
            list->unique_size--;
            if (i != list->unique_size) {
                list->unique[i].expr_size = list->unique[list->unique_size].expr_size;
                list->unique[i].expr = list->unique[list->unique_size].expr;
            }

            if (!list->unique_size) {
                free(list->unique);
                list->unique = NULL;
            } else {
                list->unique[list->unique_size].expr_size = 0;
                list->unique[list->unique_size].expr = NULL;
            }

            k = i; /* remember index for removing extensions */
            i = -1; /* set match flag */
            break;
        }
    }

    if (i != -1) {
        /* no match found */
        LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "unique");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
        return EXIT_FAILURE;
    }

    /* remove extensions of this unique instance from the target node */
    j = -1;
    while ((j = lys_ext_iter(list->ext, list->ext_size, j + 1, LYEXT_SUBSTMT_UNIQUE)) != -1) {
        if (list->ext[j]->insubstmt_index == k) {
            lyp_ext_instance_rm(module->ctx, &list->ext, &list->ext_size, j);
            --j;
        } else if (list->ext[j]->insubstmt_index > k) {
            /* decrease the substatement index of the extension because of the changed array of uniques */
            list->ext[j]->insubstmt_index--;
        }
    }
    return EXIT_SUCCESS;
}